

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::BVHNIntersector1<8,_16781328,_false,_embree::avx::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [32];
  float fVar7;
  float fVar8;
  undefined1 auVar9 [32];
  byte bVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 (*pauVar29) [16];
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  undefined1 (*pauVar33) [16];
  ulong uVar34;
  long lVar35;
  undefined1 (*pauVar36) [16];
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 (*pauVar40) [16];
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar46 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  float fVar58;
  undefined1 auVar57 [16];
  undefined1 auVar56 [64];
  undefined1 auVar60 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  vfloat4 a0;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar70 [16];
  undefined1 auVar74 [32];
  float fVar77;
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  float fVar82;
  undefined1 auVar81 [64];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  float fVar91;
  float fVar95;
  float fVar96;
  undefined1 auVar92 [16];
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar93 [32];
  float fVar97;
  undefined1 auVar94 [32];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar109 [32];
  float fVar114;
  undefined1 auVar110 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar120 [32];
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [8];
  float fStack_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  float fStack_2564;
  float local_2560;
  float fStack_255c;
  float fStack_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  float local_2540;
  float fStack_253c;
  float fStack_2538;
  float fStack_2534;
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  float fStack_2524;
  float local_2520;
  float fStack_251c;
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  float local_2500;
  float fStack_24fc;
  float fStack_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  float local_24e0;
  float fStack_24dc;
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  float fStack_24a4;
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  undefined4 uStack_2464;
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  undefined4 uStack_2444;
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  undefined4 uStack_2424;
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  float local_2400;
  float fStack_23fc;
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  float local_23e0 [4];
  undefined1 local_23d0 [16];
  undefined1 local_23c0 [16];
  undefined1 local_23b0 [16];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar46 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
    auVar45 = vrsqrtss_avx(auVar46,auVar46);
    fVar108 = auVar45._0_4_;
    local_23e0[0] = fVar108 * 1.5 - auVar46._0_4_ * 0.5 * fVar108 * fVar108 * fVar108;
    local_24c0 = (ray->super_RayK<1>).dir.field_0.m128[0];
    fStack_24bc = local_24c0;
    fStack_24b8 = local_24c0;
    fStack_24b4 = local_24c0;
    fStack_24b0 = local_24c0;
    fStack_24ac = local_24c0;
    fStack_24a8 = local_24c0;
    fStack_24a4 = local_24c0;
    local_24e0 = (ray->super_RayK<1>).dir.field_0.m128[1];
    fStack_24dc = local_24e0;
    fStack_24d8 = local_24e0;
    fStack_24d4 = local_24e0;
    fStack_24d0 = local_24e0;
    fStack_24cc = local_24e0;
    fStack_24c8 = local_24e0;
    fStack_24c4 = local_24e0;
    local_2500 = (ray->super_RayK<1>).dir.field_0.m128[2];
    fStack_24fc = local_2500;
    fStack_24f8 = local_2500;
    fStack_24f4 = local_2500;
    fStack_24f0 = local_2500;
    fStack_24ec = local_2500;
    fStack_24e8 = local_2500;
    fStack_24e4 = local_2500;
    auVar59 = vshufps_avx(ZEXT416((uint)local_23e0[0]),ZEXT416((uint)local_23e0[0]),0);
    auVar67._0_4_ = aVar3.x * auVar59._0_4_;
    auVar67._4_4_ = aVar3.y * auVar59._4_4_;
    auVar67._8_4_ = aVar3.z * auVar59._8_4_;
    auVar67._12_4_ = aVar3.field_3.w * auVar59._12_4_;
    auVar45 = vshufpd_avx(auVar67,auVar67,1);
    auVar46 = vmovshdup_avx(auVar67);
    auVar88._8_4_ = 0x80000000;
    auVar88._0_8_ = 0x8000000080000000;
    auVar88._12_4_ = 0x80000000;
    auVar78._12_4_ = 0;
    auVar78._0_12_ = ZEXT812(0);
    auVar78 = auVar78 << 0x20;
    auVar57 = vunpckhps_avx(auVar67,auVar78);
    auVar42 = vshufps_avx(auVar57,ZEXT416(auVar46._0_4_ ^ 0x80000000),0x41);
    auVar57._0_8_ = auVar45._0_8_ ^ 0x8000000080000000;
    auVar57._8_8_ = auVar88._8_8_ ^ auVar45._8_8_;
    auVar57 = vinsertps_avx(auVar57,auVar67,0x2a);
    auVar46 = vdpps_avx(auVar42,auVar42,0x7f);
    auVar45 = vdpps_avx(auVar57,auVar57,0x7f);
    auVar46 = vcmpps_avx(auVar45,auVar46,1);
    auVar46 = vshufps_avx(auVar46,auVar46,0);
    auVar46 = vblendvps_avx(auVar57,auVar42,auVar46);
    auVar45 = vdpps_avx(auVar46,auVar46,0x7f);
    auVar57 = vrsqrtss_avx(auVar45,auVar45);
    fVar108 = auVar57._0_4_;
    auVar45 = ZEXT416((uint)(fVar108 * 1.5 - auVar45._0_4_ * 0.5 * fVar108 * fVar108 * fVar108));
    auVar45 = vshufps_avx(auVar45,auVar45,0);
    auVar86._0_4_ = auVar45._0_4_ * auVar46._0_4_;
    auVar86._4_4_ = auVar45._4_4_ * auVar46._4_4_;
    auVar86._8_4_ = auVar45._8_4_ * auVar46._8_4_;
    auVar86._12_4_ = auVar45._12_4_ * auVar46._12_4_;
    auVar46 = vshufps_avx(auVar86,auVar86,0xc9);
    auVar45 = vshufps_avx(auVar67,auVar67,0xc9);
    auVar92._0_4_ = auVar45._0_4_ * auVar86._0_4_;
    auVar92._4_4_ = auVar45._4_4_ * auVar86._4_4_;
    auVar92._8_4_ = auVar45._8_4_ * auVar86._8_4_;
    auVar92._12_4_ = auVar45._12_4_ * auVar86._12_4_;
    auVar89._0_4_ = auVar46._0_4_ * auVar67._0_4_;
    auVar89._4_4_ = auVar46._4_4_ * auVar67._4_4_;
    auVar89._8_4_ = auVar46._8_4_ * auVar67._8_4_;
    auVar89._12_4_ = auVar46._12_4_ * auVar67._12_4_;
    auVar46 = vsubps_avx(auVar89,auVar92);
    auVar57 = vshufps_avx(auVar46,auVar46,0xc9);
    auVar46 = vdpps_avx(auVar57,auVar57,0x7f);
    auVar45 = vrsqrtss_avx(auVar46,auVar46);
    fVar108 = auVar45._0_4_;
    auVar46 = ZEXT416((uint)(fVar108 * 1.5 - auVar46._0_4_ * 0.5 * fVar108 * fVar108 * fVar108));
    auVar46 = vshufps_avx(auVar46,auVar46,0);
    auVar45._0_4_ = auVar57._0_4_ * auVar46._0_4_;
    auVar45._4_4_ = auVar57._4_4_ * auVar46._4_4_;
    auVar45._8_4_ = auVar57._8_4_ * auVar46._8_4_;
    auVar45._12_4_ = auVar57._12_4_ * auVar46._12_4_;
    auVar46._0_4_ = auVar59._0_4_ * auVar67._0_4_;
    auVar46._4_4_ = auVar59._4_4_ * auVar67._4_4_;
    auVar46._8_4_ = auVar59._8_4_ * auVar67._8_4_;
    auVar46._12_4_ = auVar59._12_4_ * auVar67._12_4_;
    auVar57 = vunpcklps_avx(auVar86,auVar46);
    auVar46 = vunpckhps_avx(auVar86,auVar46);
    auVar59 = vunpcklps_avx(auVar45,auVar78);
    auVar45 = vunpckhps_avx(auVar45,auVar78);
    local_23b0 = vunpcklps_avx(auVar46,auVar45);
    local_23d0 = vunpcklps_avx(auVar57,auVar59);
    local_23c0 = vunpckhps_avx(auVar57,auVar59);
    pauVar29 = (undefined1 (*) [16])local_2390;
    auVar81 = ZEXT464(0) << 0x20;
    auVar45 = vmaxss_avx(ZEXT416(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar56 = ZEXT1664(auVar45);
    auVar57 = vmaxss_avx(ZEXT416(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar59._8_4_ = 0x7fffffff;
    auVar59._0_8_ = 0x7fffffff7fffffff;
    auVar59._12_4_ = 0x7fffffff;
    auVar46 = vandps_avx((undefined1  [16])aVar3,auVar59);
    auVar68._8_4_ = 0x219392ef;
    auVar68._0_8_ = 0x219392ef219392ef;
    auVar68._12_4_ = 0x219392ef;
    auVar46 = vcmpps_avx(auVar46,auVar68,1);
    auVar46 = vblendvps_avx((undefined1  [16])aVar3,auVar68,auVar46);
    uStack_2398 = 0;
    auVar59 = vrcpps_avx(auVar46);
    fVar108 = auVar59._0_4_;
    auVar42._0_4_ = auVar46._0_4_ * fVar108;
    fVar7 = auVar59._4_4_;
    auVar42._4_4_ = auVar46._4_4_ * fVar7;
    fVar8 = auVar59._8_4_;
    auVar42._8_4_ = auVar46._8_4_ * fVar8;
    fVar91 = auVar59._12_4_;
    auVar42._12_4_ = auVar46._12_4_ * fVar91;
    auVar69._8_4_ = 0x3f800000;
    auVar69._0_8_ = 0x3f8000003f800000;
    auVar69._12_4_ = 0x3f800000;
    auVar46 = vsubps_avx(auVar69,auVar42);
    local_2520 = (ray->super_RayK<1>).org.field_0.m128[0];
    fStack_251c = local_2520;
    fStack_2518 = local_2520;
    fStack_2514 = local_2520;
    fStack_2510 = local_2520;
    fStack_250c = local_2520;
    fStack_2508 = local_2520;
    fStack_2504 = local_2520;
    local_2540 = (ray->super_RayK<1>).org.field_0.m128[1];
    fStack_253c = local_2540;
    fStack_2538 = local_2540;
    fStack_2534 = local_2540;
    fStack_2530 = local_2540;
    fStack_252c = local_2540;
    fStack_2528 = local_2540;
    fStack_2524 = local_2540;
    local_2560 = (ray->super_RayK<1>).org.field_0.m128[2];
    fStack_255c = local_2560;
    fStack_2558 = local_2560;
    fStack_2554 = local_2560;
    fStack_2550 = local_2560;
    fStack_254c = local_2560;
    fStack_2548 = local_2560;
    fStack_2544 = local_2560;
    auVar43._0_4_ = fVar108 + fVar108 * auVar46._0_4_;
    auVar43._4_4_ = fVar7 + fVar7 * auVar46._4_4_;
    auVar43._8_4_ = fVar8 + fVar8 * auVar46._8_4_;
    auVar43._12_4_ = fVar91 + fVar91 * auVar46._12_4_;
    auVar42 = vshufps_avx(auVar43,auVar43,0);
    auVar46 = vmovshdup_avx(auVar43);
    auVar66 = ZEXT1664(auVar46);
    auVar78 = vshufps_avx(auVar43,auVar43,0x55);
    auVar59 = vshufpd_avx(auVar43,auVar43,1);
    auVar76 = ZEXT1664(auVar59);
    auVar67 = vshufps_avx(auVar43,auVar43,0xaa);
    uVar38 = (ulong)(auVar43._0_4_ < 0.0) * 0x20;
    uVar39 = (ulong)(auVar46._0_4_ < 0.0) << 5 | 0x40;
    uVar41 = (ulong)(auVar59._0_4_ < 0.0) << 5 | 0x80;
    auVar46 = vshufps_avx(auVar45,auVar45,0);
    auVar109._16_16_ = auVar46;
    auVar109._0_16_ = auVar46;
    auVar46 = vshufps_avx(auVar57,auVar57,0);
    auVar44 = ZEXT3264(CONCAT1616(auVar46,auVar46));
    do {
      auVar43 = in_ZMM14._0_16_;
      auVar59 = auVar81._0_16_;
      auVar57 = auVar76._0_16_;
      auVar45 = auVar66._0_16_;
      auVar46 = auVar56._0_16_;
      pauVar40 = pauVar29 + -1;
      pauVar29 = pauVar29 + -1;
      if (*(float *)(*pauVar40 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar30 = *(ulong *)*pauVar29;
        while ((uVar30 & 8) == 0) {
          fVar108 = (ray->super_RayK<1>).dir.field_0.m128[3];
          uVar37 = (uint)uVar30 & 7;
          uVar32 = uVar30 & 0xfffffffffffffff0;
          fVar8 = auVar42._12_4_;
          fVar7 = auVar67._12_4_;
          if (uVar37 == 3) {
            local_2440 = *(float *)(uVar32 + 0x40);
            fStack_243c = *(float *)(uVar32 + 0x44);
            fStack_2438 = *(float *)(uVar32 + 0x48);
            fStack_2434 = *(float *)(uVar32 + 0x4c);
            fStack_2430 = *(float *)(uVar32 + 0x50);
            fStack_242c = *(float *)(uVar32 + 0x54);
            fStack_2428 = *(float *)(uVar32 + 0x58);
            uStack_2424 = *(undefined4 *)(uVar32 + 0x5c);
            local_2480 = *(float *)(uVar32 + 0xc0);
            fStack_247c = *(float *)(uVar32 + 0xc4);
            fStack_2478 = *(float *)(uVar32 + 200);
            fStack_2474 = *(float *)(uVar32 + 0xcc);
            fStack_2470 = *(float *)(uVar32 + 0xd0);
            fStack_246c = *(float *)(uVar32 + 0xd4);
            fStack_2468 = *(float *)(uVar32 + 0xd8);
            uStack_2464 = *(undefined4 *)(uVar32 + 0xdc);
            local_2460 = *(float *)(uVar32 + 0xe0);
            fStack_245c = *(float *)(uVar32 + 0xe4);
            fStack_2458 = *(float *)(uVar32 + 0xe8);
            fStack_2454 = *(float *)(uVar32 + 0xec);
            fStack_2450 = *(float *)(uVar32 + 0xf0);
            fStack_244c = *(float *)(uVar32 + 0xf4);
            fStack_2448 = *(float *)(uVar32 + 0xf8);
            uStack_2444 = *(undefined4 *)(uVar32 + 0xfc);
            auVar46 = vshufps_avx(ZEXT416((uint)fVar108),ZEXT416((uint)fVar108),0);
            fVar112 = auVar46._0_4_;
            fVar96 = auVar46._4_4_;
            fVar114 = auVar46._8_4_;
            fVar97 = auVar46._12_4_;
            fVar108 = 1.0 - fVar108;
            auVar46 = vshufps_avx(ZEXT416((uint)(fVar108 * 0.0)),ZEXT416((uint)(fVar108 * 0.0)),0);
            fStack_2410 = auVar46._0_4_;
            fStack_240c = auVar46._4_4_;
            fStack_2408 = auVar46._8_4_;
            fVar113 = auVar46._12_4_;
            local_2580._4_4_ = fStack_240c + fVar96 * *(float *)(uVar32 + 0x1c4);
            local_2580._0_4_ = fStack_2410 + fVar112 * *(float *)(uVar32 + 0x1c0);
            fStack_2578 = fStack_2408 + fVar114 * *(float *)(uVar32 + 0x1c8);
            fStack_2574 = fVar113 + fVar97 * *(float *)(uVar32 + 0x1cc);
            fStack_2570 = fStack_2410 + fVar112 * *(float *)(uVar32 + 0x1d0);
            fStack_256c = fStack_240c + fVar96 * *(float *)(uVar32 + 0x1d4);
            fStack_2568 = fStack_2408 + fVar114 * *(float *)(uVar32 + 0x1d8);
            fStack_2564 = fVar113 + 0.0;
            local_2400 = fStack_2410 + fVar112 * *(float *)(uVar32 + 0x1e0);
            fStack_23fc = fStack_240c + fVar96 * *(float *)(uVar32 + 0x1e4);
            fStack_23f8 = fStack_2408 + fVar114 * *(float *)(uVar32 + 0x1e8);
            fStack_23f4 = fVar113 + fVar97 * *(float *)(uVar32 + 0x1ec);
            fStack_23f0 = fStack_2410 + fVar112 * *(float *)(uVar32 + 0x1f0);
            fStack_23ec = fStack_240c + fVar96 * *(float *)(uVar32 + 500);
            fStack_23e8 = fStack_2408 + fVar114 * *(float *)(uVar32 + 0x1f8);
            fStack_23e4 = fVar113 + fVar8;
            local_2420 = fStack_2410 + fVar112 * *(float *)(uVar32 + 0x200);
            fStack_241c = fStack_240c + fVar96 * *(float *)(uVar32 + 0x204);
            fStack_2418 = fStack_2408 + fVar114 * *(float *)(uVar32 + 0x208);
            fStack_2414 = fVar113 + fVar97 * *(float *)(uVar32 + 0x20c);
            fStack_2410 = fStack_2410 + fVar112 * *(float *)(uVar32 + 0x210);
            fStack_240c = fStack_240c + fVar96 * *(float *)(uVar32 + 0x214);
            fStack_2408 = fStack_2408 + fVar114 * *(float *)(uVar32 + 0x218);
            fStack_2404 = fVar113 + fVar7;
            auVar63._0_4_ =
                 local_24c0 * local_2440 +
                 local_24e0 * *(float *)(uVar32 + 0xa0) + *(float *)(uVar32 + 0x100) * local_2500;
            auVar63._4_4_ =
                 fStack_24bc * fStack_243c +
                 fStack_24dc * *(float *)(uVar32 + 0xa4) + *(float *)(uVar32 + 0x104) * fStack_24fc;
            auVar63._8_4_ =
                 fStack_24b8 * fStack_2438 +
                 fStack_24d8 * *(float *)(uVar32 + 0xa8) + *(float *)(uVar32 + 0x108) * fStack_24f8;
            auVar63._12_4_ =
                 fStack_24b4 * fStack_2434 +
                 fStack_24d4 * *(float *)(uVar32 + 0xac) + *(float *)(uVar32 + 0x10c) * fStack_24f4;
            auVar63._16_4_ =
                 fStack_24b0 * fStack_2430 +
                 fStack_24d0 * *(float *)(uVar32 + 0xb0) + *(float *)(uVar32 + 0x110) * fStack_24f0;
            auVar63._20_4_ =
                 fStack_24ac * fStack_242c +
                 fStack_24cc * *(float *)(uVar32 + 0xb4) + *(float *)(uVar32 + 0x114) * fStack_24ec;
            auVar63._24_4_ =
                 fStack_24a8 * fStack_2428 +
                 fStack_24c8 * *(float *)(uVar32 + 0xb8) + *(float *)(uVar32 + 0x118) * fStack_24e8;
            auVar63._28_4_ = fVar7 + in_ZMM14._28_4_ + 0.0;
            auVar119._0_4_ =
                 local_24c0 * *(float *)(uVar32 + 0x60) +
                 local_2480 * local_24e0 + local_2500 * *(float *)(uVar32 + 0x120);
            auVar119._4_4_ =
                 fStack_24bc * *(float *)(uVar32 + 100) +
                 fStack_247c * fStack_24dc + fStack_24fc * *(float *)(uVar32 + 0x124);
            auVar119._8_4_ =
                 fStack_24b8 * *(float *)(uVar32 + 0x68) +
                 fStack_2478 * fStack_24d8 + fStack_24f8 * *(float *)(uVar32 + 0x128);
            auVar119._12_4_ =
                 fStack_24b4 * *(float *)(uVar32 + 0x6c) +
                 fStack_2474 * fStack_24d4 + fStack_24f4 * *(float *)(uVar32 + 300);
            auVar119._16_4_ =
                 fStack_24b0 * *(float *)(uVar32 + 0x70) +
                 fStack_2470 * fStack_24d0 + fStack_24f0 * *(float *)(uVar32 + 0x130);
            auVar119._20_4_ =
                 fStack_24ac * *(float *)(uVar32 + 0x74) +
                 fStack_246c * fStack_24cc + fStack_24ec * *(float *)(uVar32 + 0x134);
            auVar119._24_4_ =
                 fStack_24a8 * *(float *)(uVar32 + 0x78) +
                 fStack_2468 * fStack_24c8 + fStack_24e8 * *(float *)(uVar32 + 0x138);
            auVar119._28_4_ = fVar113 + in_ZMM14._28_4_ + fVar7;
            auVar93._0_4_ =
                 *(float *)(uVar32 + 0x80) * local_24c0 +
                 local_24e0 * local_2460 + *(float *)(uVar32 + 0x140) * local_2500;
            auVar93._4_4_ =
                 *(float *)(uVar32 + 0x84) * fStack_24bc +
                 fStack_24dc * fStack_245c + *(float *)(uVar32 + 0x144) * fStack_24fc;
            auVar93._8_4_ =
                 *(float *)(uVar32 + 0x88) * fStack_24b8 +
                 fStack_24d8 * fStack_2458 + *(float *)(uVar32 + 0x148) * fStack_24f8;
            auVar93._12_4_ =
                 *(float *)(uVar32 + 0x8c) * fStack_24b4 +
                 fStack_24d4 * fStack_2454 + *(float *)(uVar32 + 0x14c) * fStack_24f4;
            auVar93._16_4_ =
                 *(float *)(uVar32 + 0x90) * fStack_24b0 +
                 fStack_24d0 * fStack_2450 + *(float *)(uVar32 + 0x150) * fStack_24f0;
            auVar93._20_4_ =
                 *(float *)(uVar32 + 0x94) * fStack_24ac +
                 fStack_24cc * fStack_244c + *(float *)(uVar32 + 0x154) * fStack_24ec;
            auVar93._24_4_ =
                 *(float *)(uVar32 + 0x98) * fStack_24a8 +
                 fStack_24c8 * fStack_2448 + *(float *)(uVar32 + 0x158) * fStack_24e8;
            auVar93._28_4_ = fVar8 + fVar7 + fVar113;
            auVar51._8_4_ = 0x7fffffff;
            auVar51._0_8_ = 0x7fffffff7fffffff;
            auVar51._12_4_ = 0x7fffffff;
            auVar51._16_4_ = 0x7fffffff;
            auVar51._20_4_ = 0x7fffffff;
            auVar51._24_4_ = 0x7fffffff;
            auVar51._28_4_ = 0x7fffffff;
            auVar94 = vandps_avx(auVar63,auVar51);
            auVar74._8_4_ = 0x219392ef;
            auVar74._0_8_ = 0x219392ef219392ef;
            auVar74._12_4_ = 0x219392ef;
            auVar74._16_4_ = 0x219392ef;
            auVar74._20_4_ = 0x219392ef;
            auVar74._24_4_ = 0x219392ef;
            auVar74._28_4_ = 0x219392ef;
            auVar94 = vcmpps_avx(auVar94,auVar74,1);
            auVar75 = vblendvps_avx(auVar63,auVar74,auVar94);
            auVar94 = vandps_avx(auVar119,auVar51);
            auVar94 = vcmpps_avx(auVar94,auVar74,1);
            auVar9 = vblendvps_avx(auVar119,auVar74,auVar94);
            auVar94 = vandps_avx(auVar93,auVar51);
            auVar6 = vcmpps_avx(auVar94,auVar74,1);
            auVar94 = vblendvps_avx(auVar93,auVar74,auVar6);
            auVar46 = vshufps_avx(ZEXT416((uint)fVar108),ZEXT416((uint)fVar108),0);
            fVar108 = auVar46._0_4_;
            auVar118._0_4_ = fVar112 * *(float *)(uVar32 + 0x220) + fVar108;
            fVar91 = auVar46._4_4_;
            auVar118._4_4_ = fVar96 * *(float *)(uVar32 + 0x224) + fVar91;
            fVar111 = auVar46._8_4_;
            auVar118._8_4_ = fVar114 * *(float *)(uVar32 + 0x228) + fVar111;
            fVar95 = auVar46._12_4_;
            auVar118._12_4_ = fVar97 * *(float *)(uVar32 + 0x22c) + fVar95;
            auVar118._16_4_ = fVar112 * *(float *)(uVar32 + 0x230) + fVar108;
            auVar118._20_4_ = fVar96 * *(float *)(uVar32 + 0x234) + fVar91;
            auVar118._24_4_ = fVar114 * *(float *)(uVar32 + 0x238) + fVar111;
            auVar118._28_4_ = auVar93._28_4_ + fVar95;
            local_24a0 = fVar112 * *(float *)(uVar32 + 0x240) + fVar108;
            fStack_249c = fVar96 * *(float *)(uVar32 + 0x244) + fVar91;
            fStack_2498 = fVar114 * *(float *)(uVar32 + 0x248) + fVar111;
            fStack_2494 = fVar97 * *(float *)(uVar32 + 0x24c) + fVar95;
            fStack_2490 = fVar112 * *(float *)(uVar32 + 0x250) + fVar108;
            fStack_248c = fVar96 * *(float *)(uVar32 + 0x254) + fVar91;
            fStack_2488 = fVar114 * *(float *)(uVar32 + 600) + fVar111;
            fStack_2484 = auVar6._28_4_ + fVar95;
            auVar120._0_4_ = fVar108 + fVar112 * *(float *)(uVar32 + 0x260);
            auVar120._4_4_ = fVar91 + fVar96 * *(float *)(uVar32 + 0x264);
            auVar120._8_4_ = fVar111 + fVar114 * *(float *)(uVar32 + 0x268);
            auVar120._12_4_ = fVar95 + fVar97 * *(float *)(uVar32 + 0x26c);
            auVar120._16_4_ = fVar108 + fVar112 * *(float *)(uVar32 + 0x270);
            auVar120._20_4_ = fVar91 + fVar96 * *(float *)(uVar32 + 0x274);
            auVar120._24_4_ = fVar111 + fVar114 * *(float *)(uVar32 + 0x278);
            auVar120._28_4_ = fVar95 + NAN;
            auVar6 = vrcpps_avx(auVar75);
            fVar108 = auVar6._0_4_;
            fVar111 = auVar6._4_4_;
            auVar16._4_4_ = auVar75._4_4_ * fVar111;
            auVar16._0_4_ = auVar75._0_4_ * fVar108;
            fVar112 = auVar6._8_4_;
            auVar16._8_4_ = auVar75._8_4_ * fVar112;
            fVar114 = auVar6._12_4_;
            auVar16._12_4_ = auVar75._12_4_ * fVar114;
            fVar115 = auVar6._16_4_;
            auVar16._16_4_ = auVar75._16_4_ * fVar115;
            fVar116 = auVar6._20_4_;
            auVar16._20_4_ = auVar75._20_4_ * fVar116;
            fVar117 = auVar6._24_4_;
            auVar16._24_4_ = auVar75._24_4_ * fVar117;
            auVar16._28_4_ = fVar95;
            auVar64._8_4_ = 0x3f800000;
            auVar64._0_8_ = 0x3f8000003f800000;
            auVar64._12_4_ = 0x3f800000;
            auVar64._16_4_ = 0x3f800000;
            auVar64._20_4_ = 0x3f800000;
            auVar64._24_4_ = 0x3f800000;
            auVar64._28_4_ = 0x3f800000;
            auVar6 = vsubps_avx(auVar64,auVar16);
            fVar108 = fVar108 + fVar108 * auVar6._0_4_;
            fVar111 = fVar111 + fVar111 * auVar6._4_4_;
            fVar112 = fVar112 + fVar112 * auVar6._8_4_;
            fVar114 = fVar114 + fVar114 * auVar6._12_4_;
            fVar115 = fVar115 + fVar115 * auVar6._16_4_;
            fVar116 = fVar116 + fVar116 * auVar6._20_4_;
            fVar117 = fVar117 + fVar117 * auVar6._24_4_;
            auVar75 = vrcpps_avx(auVar9);
            fVar91 = auVar75._0_4_;
            fVar95 = auVar75._4_4_;
            auVar17._4_4_ = auVar9._4_4_ * fVar95;
            auVar17._0_4_ = auVar9._0_4_ * fVar91;
            fVar96 = auVar75._8_4_;
            auVar17._8_4_ = auVar9._8_4_ * fVar96;
            fVar97 = auVar75._12_4_;
            auVar17._12_4_ = auVar9._12_4_ * fVar97;
            fVar98 = auVar75._16_4_;
            auVar17._16_4_ = auVar9._16_4_ * fVar98;
            fVar99 = auVar75._20_4_;
            auVar17._20_4_ = auVar9._20_4_ * fVar99;
            fVar100 = auVar75._24_4_;
            auVar17._24_4_ = auVar9._24_4_ * fVar100;
            auVar17._28_4_ = auVar6._28_4_;
            auVar9 = vsubps_avx(auVar64,auVar17);
            auVar75 = vrcpps_avx(auVar94);
            fVar91 = fVar91 + fVar91 * auVar9._0_4_;
            fVar95 = fVar95 + fVar95 * auVar9._4_4_;
            fVar96 = fVar96 + fVar96 * auVar9._8_4_;
            fVar97 = fVar97 + fVar97 * auVar9._12_4_;
            fVar98 = fVar98 + fVar98 * auVar9._16_4_;
            fVar99 = fVar99 + fVar99 * auVar9._20_4_;
            fVar100 = fVar100 + fVar100 * auVar9._24_4_;
            fVar101 = auVar75._0_4_;
            fVar102 = auVar75._4_4_;
            auVar6._4_4_ = fVar102 * auVar94._4_4_;
            auVar6._0_4_ = fVar101 * auVar94._0_4_;
            fVar103 = auVar75._8_4_;
            auVar6._8_4_ = fVar103 * auVar94._8_4_;
            fVar104 = auVar75._12_4_;
            auVar6._12_4_ = fVar104 * auVar94._12_4_;
            fVar105 = auVar75._16_4_;
            auVar6._16_4_ = fVar105 * auVar94._16_4_;
            fVar106 = auVar75._20_4_;
            auVar6._20_4_ = fVar106 * auVar94._20_4_;
            fVar107 = auVar75._24_4_;
            auVar6._24_4_ = fVar107 * auVar94._24_4_;
            auVar6._28_4_ = auVar9._28_4_;
            auVar75 = vsubps_avx(auVar64,auVar6);
            fVar77 = auVar94._28_4_ + *(float *)(uVar32 + 0x17c);
            fVar101 = fVar101 + fVar101 * auVar75._0_4_;
            fVar102 = fVar102 + fVar102 * auVar75._4_4_;
            fVar103 = fVar103 + fVar103 * auVar75._8_4_;
            fVar104 = fVar104 + fVar104 * auVar75._12_4_;
            fVar105 = fVar105 + fVar105 * auVar75._16_4_;
            fVar106 = fVar106 + fVar106 * auVar75._20_4_;
            fVar107 = fVar107 + fVar107 * auVar75._24_4_;
            fVar58 = auVar75._28_4_ + fVar77;
            fVar82 = *(float *)(uVar32 + 0x13c) +
                     *(float *)(uVar32 + 0xbc) + *(float *)(uVar32 + 0x1bc);
            auVar85._0_4_ =
                 local_2520 * local_2440 +
                 local_2540 * *(float *)(uVar32 + 0xa0) +
                 *(float *)(uVar32 + 0x100) * local_2560 + *(float *)(uVar32 + 0x160);
            auVar85._4_4_ =
                 fStack_251c * fStack_243c +
                 fStack_253c * *(float *)(uVar32 + 0xa4) +
                 *(float *)(uVar32 + 0x104) * fStack_255c + *(float *)(uVar32 + 0x164);
            auVar85._8_4_ =
                 fStack_2518 * fStack_2438 +
                 fStack_2538 * *(float *)(uVar32 + 0xa8) +
                 *(float *)(uVar32 + 0x108) * fStack_2558 + *(float *)(uVar32 + 0x168);
            auVar85._12_4_ =
                 fStack_2514 * fStack_2434 +
                 fStack_2534 * *(float *)(uVar32 + 0xac) +
                 *(float *)(uVar32 + 0x10c) * fStack_2554 + *(float *)(uVar32 + 0x16c);
            auVar85._16_4_ =
                 fStack_2510 * fStack_2430 +
                 fStack_2530 * *(float *)(uVar32 + 0xb0) +
                 *(float *)(uVar32 + 0x110) * fStack_2550 + *(float *)(uVar32 + 0x170);
            auVar85._20_4_ =
                 fStack_250c * fStack_242c +
                 fStack_252c * *(float *)(uVar32 + 0xb4) +
                 *(float *)(uVar32 + 0x114) * fStack_254c + *(float *)(uVar32 + 0x174);
            auVar85._24_4_ =
                 fStack_2508 * fStack_2428 +
                 fStack_2528 * *(float *)(uVar32 + 0xb8) +
                 *(float *)(uVar32 + 0x118) * fStack_2548 + *(float *)(uVar32 + 0x178);
            auVar85._28_4_ = *(float *)(uVar32 + 0x13c) + fVar58;
            auVar87._0_4_ =
                 local_2520 * *(float *)(uVar32 + 0x60) +
                 local_2540 * local_2480 +
                 local_2560 * *(float *)(uVar32 + 0x120) + *(float *)(uVar32 + 0x180);
            auVar87._4_4_ =
                 fStack_251c * *(float *)(uVar32 + 100) +
                 fStack_253c * fStack_247c +
                 fStack_255c * *(float *)(uVar32 + 0x124) + *(float *)(uVar32 + 0x184);
            auVar87._8_4_ =
                 fStack_2518 * *(float *)(uVar32 + 0x68) +
                 fStack_2538 * fStack_2478 +
                 fStack_2558 * *(float *)(uVar32 + 0x128) + *(float *)(uVar32 + 0x188);
            auVar87._12_4_ =
                 fStack_2514 * *(float *)(uVar32 + 0x6c) +
                 fStack_2534 * fStack_2474 +
                 fStack_2554 * *(float *)(uVar32 + 300) + *(float *)(uVar32 + 0x18c);
            auVar87._16_4_ =
                 fStack_2510 * *(float *)(uVar32 + 0x70) +
                 fStack_2530 * fStack_2470 +
                 fStack_2550 * *(float *)(uVar32 + 0x130) + *(float *)(uVar32 + 400);
            auVar87._20_4_ =
                 fStack_250c * *(float *)(uVar32 + 0x74) +
                 fStack_252c * fStack_246c +
                 fStack_254c * *(float *)(uVar32 + 0x134) + *(float *)(uVar32 + 0x194);
            auVar87._24_4_ =
                 fStack_2508 * *(float *)(uVar32 + 0x78) +
                 fStack_2528 * fStack_2468 +
                 fStack_2548 * *(float *)(uVar32 + 0x138) + *(float *)(uVar32 + 0x198);
            auVar87._28_4_ =
                 fVar58 + *(float *)(uVar32 + 0xbc) + fVar77 + *(float *)(uVar32 + 0x19c);
            auVar90._0_4_ =
                 local_2520 * *(float *)(uVar32 + 0x80) +
                 local_2540 * local_2460 +
                 *(float *)(uVar32 + 0x140) * local_2560 + *(float *)(uVar32 + 0x1a0);
            auVar90._4_4_ =
                 fStack_251c * *(float *)(uVar32 + 0x84) +
                 fStack_253c * fStack_245c +
                 *(float *)(uVar32 + 0x144) * fStack_255c + *(float *)(uVar32 + 0x1a4);
            auVar90._8_4_ =
                 fStack_2518 * *(float *)(uVar32 + 0x88) +
                 fStack_2538 * fStack_2458 +
                 *(float *)(uVar32 + 0x148) * fStack_2558 + *(float *)(uVar32 + 0x1a8);
            auVar90._12_4_ =
                 fStack_2514 * *(float *)(uVar32 + 0x8c) +
                 fStack_2534 * fStack_2454 +
                 *(float *)(uVar32 + 0x14c) * fStack_2554 + *(float *)(uVar32 + 0x1ac);
            auVar90._16_4_ =
                 fStack_2510 * *(float *)(uVar32 + 0x90) +
                 fStack_2530 * fStack_2450 +
                 *(float *)(uVar32 + 0x150) * fStack_2550 + *(float *)(uVar32 + 0x1b0);
            auVar90._20_4_ =
                 fStack_250c * *(float *)(uVar32 + 0x94) +
                 fStack_252c * fStack_244c +
                 *(float *)(uVar32 + 0x154) * fStack_254c + *(float *)(uVar32 + 0x1b4);
            auVar90._24_4_ =
                 fStack_2508 * *(float *)(uVar32 + 0x98) +
                 fStack_2528 * fStack_2448 +
                 *(float *)(uVar32 + 0x158) * fStack_2548 + *(float *)(uVar32 + 0x1b8);
            auVar90._28_4_ = fVar58 + fVar82;
            auVar94 = vsubps_avx(_local_2580,auVar85);
            auVar28._4_4_ = fStack_23fc;
            auVar28._0_4_ = local_2400;
            auVar28._8_4_ = fStack_23f8;
            auVar28._12_4_ = fStack_23f4;
            auVar28._16_4_ = fStack_23f0;
            auVar28._20_4_ = fStack_23ec;
            auVar28._24_4_ = fStack_23e8;
            auVar28._28_4_ = fVar113 + fVar8;
            auVar75 = vsubps_avx(auVar28,auVar87);
            auVar27._4_4_ = fStack_241c;
            auVar27._0_4_ = local_2420;
            auVar27._8_4_ = fStack_2418;
            auVar27._12_4_ = fStack_2414;
            auVar27._16_4_ = fStack_2410;
            auVar27._20_4_ = fStack_240c;
            auVar27._24_4_ = fStack_2408;
            auVar27._28_4_ = fVar113 + fVar7;
            auVar9 = vsubps_avx(auVar27,auVar90);
            auVar79._0_4_ = fVar108 * auVar94._0_4_;
            auVar79._4_4_ = fVar111 * auVar94._4_4_;
            auVar79._8_4_ = fVar112 * auVar94._8_4_;
            auVar79._12_4_ = fVar114 * auVar94._12_4_;
            auVar18._16_4_ = fVar115 * auVar94._16_4_;
            auVar18._0_16_ = auVar79;
            auVar18._20_4_ = fVar116 * auVar94._20_4_;
            auVar18._24_4_ = fVar117 * auVar94._24_4_;
            auVar18._28_4_ = fVar82;
            auVar70._0_4_ = fVar91 * auVar75._0_4_;
            auVar70._4_4_ = fVar95 * auVar75._4_4_;
            auVar70._8_4_ = fVar96 * auVar75._8_4_;
            auVar70._12_4_ = fVar97 * auVar75._12_4_;
            auVar19._16_4_ = fVar98 * auVar75._16_4_;
            auVar19._0_16_ = auVar70;
            auVar19._20_4_ = fVar99 * auVar75._20_4_;
            auVar19._24_4_ = fVar100 * auVar75._24_4_;
            auVar19._28_4_ = auVar75._28_4_;
            auVar53._0_4_ = auVar9._0_4_ * fVar101;
            auVar53._4_4_ = auVar9._4_4_ * fVar102;
            auVar53._8_4_ = auVar9._8_4_ * fVar103;
            auVar53._12_4_ = auVar9._12_4_ * fVar104;
            auVar20._16_4_ = auVar9._16_4_ * fVar105;
            auVar20._0_16_ = auVar53;
            auVar20._20_4_ = auVar9._20_4_ * fVar106;
            auVar20._24_4_ = auVar9._24_4_ * fVar107;
            auVar20._28_4_ = auVar94._28_4_;
            auVar94 = vsubps_avx(auVar118,auVar85);
            auVar9._4_4_ = fStack_249c;
            auVar9._0_4_ = local_24a0;
            auVar9._8_4_ = fStack_2498;
            auVar9._12_4_ = fStack_2494;
            auVar9._16_4_ = fStack_2490;
            auVar9._20_4_ = fStack_248c;
            auVar9._24_4_ = fStack_2488;
            auVar9._28_4_ = fStack_2484;
            auVar75 = vsubps_avx(auVar9,auVar87);
            auVar9 = vsubps_avx(auVar120,auVar90);
            auVar60._0_4_ = fVar108 * auVar94._0_4_;
            auVar60._4_4_ = fVar111 * auVar94._4_4_;
            auVar60._8_4_ = fVar112 * auVar94._8_4_;
            auVar60._12_4_ = fVar114 * auVar94._12_4_;
            auVar21._16_4_ = fVar115 * auVar94._16_4_;
            auVar21._0_16_ = auVar60;
            auVar21._20_4_ = fVar116 * auVar94._20_4_;
            auVar21._24_4_ = fVar117 * auVar94._24_4_;
            auVar21._28_4_ = 0x3f800000;
            auVar83._0_4_ = fVar91 * auVar75._0_4_;
            auVar83._4_4_ = fVar95 * auVar75._4_4_;
            auVar83._8_4_ = fVar96 * auVar75._8_4_;
            auVar83._12_4_ = fVar97 * auVar75._12_4_;
            auVar22._16_4_ = fVar98 * auVar75._16_4_;
            auVar22._0_16_ = auVar83;
            auVar22._20_4_ = fVar99 * auVar75._20_4_;
            auVar22._24_4_ = fVar100 * auVar75._24_4_;
            auVar22._28_4_ = auVar94._28_4_;
            auVar47._0_4_ = auVar9._0_4_ * fVar101;
            auVar47._4_4_ = auVar9._4_4_ * fVar102;
            auVar47._8_4_ = auVar9._8_4_ * fVar103;
            auVar47._12_4_ = auVar9._12_4_ * fVar104;
            auVar23._16_4_ = auVar9._16_4_ * fVar105;
            auVar23._0_16_ = auVar47;
            auVar23._20_4_ = auVar9._20_4_ * fVar106;
            auVar23._24_4_ = auVar9._24_4_ * fVar107;
            auVar23._28_4_ = fStack_2484;
            auVar46 = vpminsd_avx(auVar18._16_16_,auVar21._16_16_);
            auVar45 = vpminsd_avx(auVar79,auVar60);
            register0x00001450 = auVar46;
            _local_2580 = auVar45;
            auVar46 = vpminsd_avx(auVar19._16_16_,auVar22._16_16_);
            auVar45 = vpminsd_avx(auVar70,auVar83);
            auVar110._16_16_ = auVar46;
            auVar110._0_16_ = auVar45;
            auVar57 = auVar20._16_16_;
            in_ZMM14 = ZEXT1664(auVar57);
            auVar46 = vpminsd_avx(auVar57,auVar23._16_16_);
            auVar45 = vpminsd_avx(auVar53,auVar47);
            auVar94._16_16_ = auVar46;
            auVar94._0_16_ = auVar45;
            auVar94 = vmaxps_avx(auVar110,auVar94);
            auVar46 = vpmaxsd_avx(auVar18._16_16_,auVar21._16_16_);
            auVar45 = vpmaxsd_avx(auVar79,auVar60);
            auVar65._16_16_ = auVar46;
            auVar65._0_16_ = auVar45;
            auVar46 = vpmaxsd_avx(auVar19._16_16_,auVar22._16_16_);
            auVar45 = vpmaxsd_avx(auVar70,auVar83);
            auVar75._16_16_ = auVar46;
            auVar75._0_16_ = auVar45;
            auVar46 = vpmaxsd_avx(auVar57,auVar23._16_16_);
            auVar81 = ZEXT1664(auVar46);
            auVar45 = vpmaxsd_avx(auVar53,auVar47);
            auVar52._16_16_ = auVar46;
            auVar52._0_16_ = auVar45;
            auVar6 = vminps_avx(auVar75,auVar52);
            auVar9 = vmaxps_avx(auVar109,_local_2580);
            auVar94 = vmaxps_avx(auVar9,auVar94);
            auVar56 = ZEXT3264(auVar94);
            auVar9 = vminps_avx(auVar44._0_32_,auVar65);
            auVar9 = vminps_avx(auVar9,auVar6);
            auVar94 = vcmpps_avx(auVar94,auVar9,2);
LAB_014c54c2:
            auVar66 = ZEXT1664(auVar94._16_16_);
            auVar46 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
          }
          else {
            auVar46 = vshufps_avx(ZEXT416((uint)fVar108),ZEXT416((uint)fVar108),0);
            auVar50._16_16_ = auVar46;
            auVar50._0_16_ = auVar46;
            pfVar2 = (float *)(uVar32 + 0x100 + uVar38);
            fVar108 = auVar46._0_4_;
            fVar91 = auVar46._4_4_;
            fVar111 = auVar46._8_4_;
            fVar95 = auVar46._12_4_;
            pfVar1 = (float *)(uVar32 + 0x40 + uVar38);
            auVar55._0_4_ = fVar108 * *pfVar2 + *pfVar1;
            auVar55._4_4_ = fVar91 * pfVar2[1] + pfVar1[1];
            auVar55._8_4_ = fVar111 * pfVar2[2] + pfVar1[2];
            auVar55._12_4_ = fVar95 * pfVar2[3] + pfVar1[3];
            auVar55._16_4_ = fVar108 * pfVar2[4] + pfVar1[4];
            auVar55._20_4_ = fVar91 * pfVar2[5] + pfVar1[5];
            auVar55._24_4_ = fVar111 * pfVar2[6] + pfVar1[6];
            auVar55._28_4_ = auVar56._28_4_ + pfVar1[7];
            auVar26._4_4_ = fStack_251c;
            auVar26._0_4_ = local_2520;
            auVar26._8_4_ = fStack_2518;
            auVar26._12_4_ = fStack_2514;
            auVar26._16_4_ = fStack_2510;
            auVar26._20_4_ = fStack_250c;
            auVar26._24_4_ = fStack_2508;
            auVar26._28_4_ = fStack_2504;
            auVar94 = vsubps_avx(auVar55,auVar26);
            fVar112 = auVar42._0_4_;
            fVar96 = auVar42._4_4_;
            auVar11._4_4_ = fVar96 * auVar94._4_4_;
            auVar11._0_4_ = fVar112 * auVar94._0_4_;
            fVar114 = auVar42._8_4_;
            auVar11._8_4_ = fVar114 * auVar94._8_4_;
            auVar11._12_4_ = fVar8 * auVar94._12_4_;
            auVar11._16_4_ = fVar112 * auVar94._16_4_;
            auVar11._20_4_ = fVar96 * auVar94._20_4_;
            auVar11._24_4_ = fVar114 * auVar94._24_4_;
            auVar11._28_4_ = auVar94._28_4_;
            pfVar2 = (float *)(uVar32 + 0x100 + uVar39);
            pfVar1 = (float *)(uVar32 + 0x40 + uVar39);
            auVar62._0_4_ = fVar108 * *pfVar2 + *pfVar1;
            auVar62._4_4_ = fVar91 * pfVar2[1] + pfVar1[1];
            auVar62._8_4_ = fVar111 * pfVar2[2] + pfVar1[2];
            auVar62._12_4_ = fVar95 * pfVar2[3] + pfVar1[3];
            auVar62._16_4_ = fVar108 * pfVar2[4] + pfVar1[4];
            auVar62._20_4_ = fVar91 * pfVar2[5] + pfVar1[5];
            auVar62._24_4_ = fVar111 * pfVar2[6] + pfVar1[6];
            auVar62._28_4_ = auVar66._28_4_ + pfVar1[7];
            auVar25._4_4_ = fStack_253c;
            auVar25._0_4_ = local_2540;
            auVar25._8_4_ = fStack_2538;
            auVar25._12_4_ = fStack_2534;
            auVar25._16_4_ = fStack_2530;
            auVar25._20_4_ = fStack_252c;
            auVar25._24_4_ = fStack_2528;
            auVar25._28_4_ = fStack_2524;
            auVar94 = vsubps_avx(auVar62,auVar25);
            fVar97 = auVar78._0_4_;
            fVar115 = auVar78._4_4_;
            auVar12._4_4_ = fVar115 * auVar94._4_4_;
            auVar12._0_4_ = fVar97 * auVar94._0_4_;
            fVar98 = auVar78._8_4_;
            auVar12._8_4_ = fVar98 * auVar94._8_4_;
            auVar12._12_4_ = auVar78._12_4_ * auVar94._12_4_;
            auVar12._16_4_ = fVar97 * auVar94._16_4_;
            auVar12._20_4_ = fVar115 * auVar94._20_4_;
            auVar12._24_4_ = fVar98 * auVar94._24_4_;
            auVar12._28_4_ = auVar94._28_4_;
            pfVar2 = (float *)(uVar32 + 0x100 + uVar41);
            pfVar1 = (float *)(uVar32 + 0x40 + uVar41);
            auVar72._0_4_ = fVar108 * *pfVar2 + *pfVar1;
            auVar72._4_4_ = fVar91 * pfVar2[1] + pfVar1[1];
            auVar72._8_4_ = fVar111 * pfVar2[2] + pfVar1[2];
            auVar72._12_4_ = fVar95 * pfVar2[3] + pfVar1[3];
            auVar72._16_4_ = fVar108 * pfVar2[4] + pfVar1[4];
            auVar72._20_4_ = fVar91 * pfVar2[5] + pfVar1[5];
            auVar72._24_4_ = fVar111 * pfVar2[6] + pfVar1[6];
            auVar72._28_4_ = auVar76._28_4_ + pfVar1[7];
            auVar24._4_4_ = fStack_255c;
            auVar24._0_4_ = local_2560;
            auVar24._8_4_ = fStack_2558;
            auVar24._12_4_ = fStack_2554;
            auVar24._16_4_ = fStack_2550;
            auVar24._20_4_ = fStack_254c;
            auVar24._24_4_ = fStack_2548;
            auVar24._28_4_ = fStack_2544;
            auVar94 = vsubps_avx(auVar72,auVar24);
            fVar116 = auVar67._0_4_;
            fVar99 = auVar67._4_4_;
            auVar13._4_4_ = fVar99 * auVar94._4_4_;
            auVar13._0_4_ = fVar116 * auVar94._0_4_;
            fVar117 = auVar67._8_4_;
            auVar13._8_4_ = fVar117 * auVar94._8_4_;
            auVar13._12_4_ = fVar7 * auVar94._12_4_;
            auVar13._16_4_ = fVar116 * auVar94._16_4_;
            auVar13._20_4_ = fVar99 * auVar94._20_4_;
            auVar13._24_4_ = fVar117 * auVar94._24_4_;
            auVar13._28_4_ = auVar94._28_4_;
            pfVar2 = (float *)(uVar32 + 0x100 + (uVar38 ^ 0x20));
            auVar94 = vmaxps_avx(auVar12,auVar13);
            pfVar1 = (float *)(uVar32 + 0x40 + (uVar38 ^ 0x20));
            auVar73._0_4_ = fVar108 * *pfVar2 + *pfVar1;
            auVar73._4_4_ = fVar91 * pfVar2[1] + pfVar1[1];
            auVar73._8_4_ = fVar111 * pfVar2[2] + pfVar1[2];
            auVar73._12_4_ = fVar95 * pfVar2[3] + pfVar1[3];
            auVar73._16_4_ = fVar108 * pfVar2[4] + pfVar1[4];
            auVar73._20_4_ = fVar91 * pfVar2[5] + pfVar1[5];
            auVar73._24_4_ = fVar111 * pfVar2[6] + pfVar1[6];
            auVar73._28_4_ = auVar81._28_4_ + pfVar1[7];
            auVar9 = vsubps_avx(auVar73,auVar26);
            pfVar2 = (float *)(uVar32 + 0x100 + (uVar39 ^ 0x20));
            pfVar1 = (float *)(uVar32 + 0x40 + (uVar39 ^ 0x20));
            auVar80._0_4_ = fVar108 * *pfVar2 + *pfVar1;
            auVar80._4_4_ = fVar91 * pfVar2[1] + pfVar1[1];
            auVar80._8_4_ = fVar111 * pfVar2[2] + pfVar1[2];
            auVar80._12_4_ = fVar95 * pfVar2[3] + pfVar1[3];
            auVar80._16_4_ = fVar108 * pfVar2[4] + pfVar1[4];
            auVar80._20_4_ = fVar91 * pfVar2[5] + pfVar1[5];
            auVar80._24_4_ = fVar111 * pfVar2[6] + pfVar1[6];
            auVar80._28_4_ = auVar81._28_4_ + pfVar1[7];
            auVar75._4_4_ = fVar96 * auVar9._4_4_;
            auVar75._0_4_ = fVar112 * auVar9._0_4_;
            auVar75._8_4_ = fVar114 * auVar9._8_4_;
            auVar75._12_4_ = fVar8 * auVar9._12_4_;
            auVar75._16_4_ = fVar112 * auVar9._16_4_;
            auVar75._20_4_ = fVar96 * auVar9._20_4_;
            auVar75._24_4_ = fVar114 * auVar9._24_4_;
            auVar75._28_4_ = auVar9._28_4_;
            auVar9 = vsubps_avx(auVar80,auVar25);
            pfVar2 = (float *)(uVar32 + 0x100 + (uVar41 ^ 0x20));
            auVar14._4_4_ = fVar115 * auVar9._4_4_;
            auVar14._0_4_ = fVar97 * auVar9._0_4_;
            auVar14._8_4_ = fVar98 * auVar9._8_4_;
            auVar14._12_4_ = auVar78._12_4_ * auVar9._12_4_;
            auVar14._16_4_ = fVar97 * auVar9._16_4_;
            auVar14._20_4_ = fVar115 * auVar9._20_4_;
            auVar14._24_4_ = fVar98 * auVar9._24_4_;
            auVar14._28_4_ = auVar9._28_4_;
            pfVar1 = (float *)(uVar32 + 0x40 + (uVar41 ^ 0x20));
            auVar84._0_4_ = fVar108 * *pfVar2 + *pfVar1;
            auVar84._4_4_ = fVar91 * pfVar2[1] + pfVar1[1];
            auVar84._8_4_ = fVar111 * pfVar2[2] + pfVar1[2];
            auVar84._12_4_ = fVar95 * pfVar2[3] + pfVar1[3];
            auVar84._16_4_ = fVar108 * pfVar2[4] + pfVar1[4];
            auVar84._20_4_ = fVar91 * pfVar2[5] + pfVar1[5];
            auVar84._24_4_ = fVar111 * pfVar2[6] + pfVar1[6];
            auVar84._28_4_ = fStack_2504 + pfVar1[7];
            auVar9 = vsubps_avx(auVar84,auVar24);
            auVar15._4_4_ = fVar99 * auVar9._4_4_;
            auVar15._0_4_ = fVar116 * auVar9._0_4_;
            auVar15._8_4_ = fVar117 * auVar9._8_4_;
            auVar15._12_4_ = fVar7 * auVar9._12_4_;
            auVar15._16_4_ = fVar116 * auVar9._16_4_;
            auVar15._20_4_ = fVar99 * auVar9._20_4_;
            auVar15._24_4_ = fVar117 * auVar9._24_4_;
            auVar15._28_4_ = auVar9._28_4_;
            auVar6 = vminps_avx(auVar14,auVar15);
            auVar81 = ZEXT3264(auVar6);
            auVar9 = vmaxps_avx(auVar109,auVar11);
            auVar94 = vmaxps_avx(auVar9,auVar94);
            auVar56 = ZEXT3264(auVar94);
            auVar9 = vminps_avx(auVar44._0_32_,auVar75);
            auVar9 = vminps_avx(auVar9,auVar6);
            auVar94 = vcmpps_avx(auVar94,auVar9,2);
            auVar66 = ZEXT3264(auVar94);
            if (uVar37 == 6) {
              auVar75 = vcmpps_avx(*(undefined1 (*) [32])(uVar32 + 0x1c0),auVar50,2);
              auVar9 = vcmpps_avx(auVar50,*(undefined1 (*) [32])(uVar32 + 0x1e0),1);
              auVar9 = vandps_avx(auVar75,auVar9);
              auVar94 = vandps_avx(auVar9,auVar94);
              goto LAB_014c54c2;
            }
            auVar46 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
          }
          auVar43 = in_ZMM14._0_16_;
          auVar76 = ZEXT3264(auVar75);
          local_25a0 = auVar56._0_32_;
          auVar46 = vpsllw_avx(auVar46,0xf);
          if ((((((((auVar46 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar46 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar46 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar46 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar46 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar46 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar46 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar46[0xf]) goto LAB_014c57eb;
          auVar46 = vpacksswb_avx(auVar46,auVar46);
          bVar10 = SUB161(auVar46 >> 7,0) & 1 | (SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar46 >> 0x17,0) & 1) << 2 | (SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar46 >> 0x27,0) & 1) << 4 | (SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar46 >> 0x37,0) & 1) << 6 | SUB161(auVar46 >> 0x3f,0) << 7;
          lVar31 = 0;
          if (bVar10 != 0) {
            for (; (bVar10 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
            }
          }
          uVar30 = *(ulong *)(uVar32 + lVar31 * 8);
          uVar37 = bVar10 - 1 & (uint)bVar10;
          pauVar40 = pauVar29;
          if (uVar37 != 0) {
            uVar4 = *(uint *)(local_25a0 + lVar31 * 4);
            lVar31 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
              }
            }
            uVar34 = *(ulong *)(uVar32 + lVar31 * 8);
            uVar5 = *(uint *)(local_25a0 + lVar31 * 4);
            uVar37 = uVar37 - 1 & uVar37;
            if (uVar37 == 0) {
              pauVar40 = pauVar29 + 1;
              if (uVar4 < uVar5) {
                *(ulong *)*pauVar29 = uVar34;
                *(uint *)(*pauVar29 + 8) = uVar5;
              }
              else {
                *(ulong *)*pauVar29 = uVar30;
                *(uint *)(*pauVar29 + 8) = uVar4;
                uVar30 = uVar34;
              }
            }
            else {
              auVar48._8_8_ = 0;
              auVar48._0_8_ = uVar30;
              auVar46 = vpunpcklqdq_avx(auVar48,ZEXT416(uVar4));
              auVar54._8_8_ = 0;
              auVar54._0_8_ = uVar34;
              auVar45 = vpunpcklqdq_avx(auVar54,ZEXT416(uVar5));
              lVar31 = 0;
              if (uVar37 != 0) {
                for (; (uVar37 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                }
              }
              auVar61._8_8_ = 0;
              auVar61._0_8_ = *(ulong *)(uVar32 + lVar31 * 8);
              auVar57 = vpunpcklqdq_avx(auVar61,ZEXT416(*(uint *)(local_25a0 + lVar31 * 4)));
              auVar66 = ZEXT1664(auVar57);
              uVar37 = uVar37 - 1 & uVar37;
              if (uVar37 == 0) {
                auVar59 = vpcmpgtd_avx(auVar45,auVar46);
                auVar68 = vpshufd_avx(auVar59,0xaa);
                auVar59 = vblendvps_avx(auVar45,auVar46,auVar68);
                auVar46 = vblendvps_avx(auVar46,auVar45,auVar68);
                auVar45 = vpcmpgtd_avx(auVar57,auVar59);
                auVar68 = vpshufd_avx(auVar45,0xaa);
                auVar45 = vblendvps_avx(auVar57,auVar59,auVar68);
                auVar76 = ZEXT1664(auVar45);
                auVar57 = vblendvps_avx(auVar59,auVar57,auVar68);
                auVar56 = ZEXT1664(auVar57);
                auVar59 = vpcmpgtd_avx(auVar57,auVar46);
                auVar68 = vpshufd_avx(auVar59,0xaa);
                auVar66 = ZEXT1664(auVar68);
                auVar59 = vblendvps_avx(auVar57,auVar46,auVar68);
                auVar81 = ZEXT1664(auVar59);
                auVar46 = vblendvps_avx(auVar46,auVar57,auVar68);
                *pauVar29 = auVar46;
                pauVar29[1] = auVar59;
                uVar30 = auVar45._0_8_;
                pauVar40 = pauVar29 + 2;
              }
              else {
                lVar31 = 0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                  }
                }
                auVar81 = ZEXT464(*(uint *)(local_25a0 + lVar31 * 4));
                auVar71._8_8_ = 0;
                auVar71._0_8_ = *(ulong *)(uVar32 + lVar31 * 8);
                auVar59 = vpunpcklqdq_avx(auVar71,ZEXT416(*(uint *)(local_25a0 + lVar31 * 4)));
                auVar76 = ZEXT1664(auVar59);
                uVar37 = uVar37 - 1 & uVar37;
                uVar34 = (ulong)uVar37;
                if (uVar37 == 0) {
                  auVar68 = vpcmpgtd_avx(auVar45,auVar46);
                  auVar69 = vpshufd_avx(auVar68,0xaa);
                  auVar68 = vblendvps_avx(auVar45,auVar46,auVar69);
                  auVar46 = vblendvps_avx(auVar46,auVar45,auVar69);
                  auVar45 = vpcmpgtd_avx(auVar59,auVar57);
                  auVar69 = vpshufd_avx(auVar45,0xaa);
                  auVar45 = vblendvps_avx(auVar59,auVar57,auVar69);
                  auVar57 = vblendvps_avx(auVar57,auVar59,auVar69);
                  auVar59 = vpcmpgtd_avx(auVar57,auVar46);
                  auVar69 = vpshufd_avx(auVar59,0xaa);
                  auVar59 = vblendvps_avx(auVar57,auVar46,auVar69);
                  auVar76 = ZEXT1664(auVar59);
                  auVar46 = vblendvps_avx(auVar46,auVar57,auVar69);
                  auVar57 = vpcmpgtd_avx(auVar45,auVar68);
                  auVar69 = vpshufd_avx(auVar57,0xaa);
                  auVar57 = vblendvps_avx(auVar45,auVar68,auVar69);
                  auVar66 = ZEXT1664(auVar57);
                  auVar45 = vblendvps_avx(auVar68,auVar45,auVar69);
                  auVar68 = vpcmpgtd_avx(auVar59,auVar45);
                  auVar69 = vpshufd_avx(auVar68,0xaa);
                  auVar81 = ZEXT1664(auVar69);
                  auVar68 = vblendvps_avx(auVar59,auVar45,auVar69);
                  auVar45 = vblendvps_avx(auVar45,auVar59,auVar69);
                  auVar56 = ZEXT1664(auVar45);
                  *pauVar29 = auVar46;
                  pauVar29[1] = auVar45;
                  pauVar29[2] = auVar68;
                  uVar30 = auVar57._0_8_;
                  pauVar40 = pauVar29 + 3;
                }
                else {
                  *pauVar29 = auVar46;
                  pauVar29[1] = auVar45;
                  pauVar29[2] = auVar57;
                  pauVar29[3] = auVar59;
                  lVar31 = 0x30;
                  do {
                    lVar35 = lVar31;
                    lVar31 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                      }
                    }
                    uVar30 = *(ulong *)(uVar32 + lVar31 * 8);
                    auVar56 = ZEXT464(*(uint *)(local_25a0 + lVar31 * 4));
                    auVar49._8_8_ = 0;
                    auVar49._0_8_ = uVar30;
                    auVar46 = vpunpcklqdq_avx(auVar49,ZEXT416(*(uint *)(local_25a0 + lVar31 * 4)));
                    *(undefined1 (*) [16])(pauVar29[1] + lVar35) = auVar46;
                    uVar34 = uVar34 & uVar34 - 1;
                    lVar31 = lVar35 + 0x10;
                  } while (uVar34 != 0);
                  pauVar40 = (undefined1 (*) [16])(pauVar29[1] + lVar35);
                  if (lVar35 + 0x10 != 0) {
                    lVar31 = 0x10;
                    pauVar33 = pauVar29;
                    do {
                      auVar46 = pauVar33[1];
                      pauVar33 = pauVar33 + 1;
                      uVar37 = vextractps_avx(auVar46,2);
                      lVar35 = lVar31;
                      do {
                        if (uVar37 <= *(uint *)(pauVar29[-1] + lVar35 + 8)) {
                          pauVar36 = (undefined1 (*) [16])(*pauVar29 + lVar35);
                          break;
                        }
                        auVar56 = ZEXT1664(*(undefined1 (*) [16])(pauVar29[-1] + lVar35));
                        *(undefined1 (*) [16])(*pauVar29 + lVar35) =
                             *(undefined1 (*) [16])(pauVar29[-1] + lVar35);
                        lVar35 = lVar35 + -0x10;
                        pauVar36 = pauVar29;
                      } while (lVar35 != 0);
                      *pauVar36 = auVar46;
                      lVar31 = lVar31 + 0x10;
                    } while (pauVar40 != pauVar33);
                    uVar30 = *(ulong *)*pauVar40;
                  }
                }
              }
            }
          }
          auVar59 = auVar81._0_16_;
          auVar57 = auVar76._0_16_;
          auVar45 = auVar66._0_16_;
          auVar46 = auVar56._0_16_;
          pauVar29 = pauVar40;
        }
        auVar56 = ZEXT1664(auVar46);
        auVar66 = ZEXT1664(auVar45);
        auVar76 = ZEXT1664(auVar57);
        auVar81 = ZEXT1664(auVar59);
        in_ZMM14 = ZEXT1664(auVar43);
        (**(code **)((long)This->leafIntersector +
                    (ulong)*(byte *)(uVar30 & 0xfffffffffffffff0) * 0x40))(local_23e0,ray,context);
        fVar108 = (ray->super_RayK<1>).tfar;
        auVar44 = ZEXT3264(CONCAT428(fVar108,CONCAT424(fVar108,CONCAT420(fVar108,CONCAT416(fVar108,
                                                  CONCAT412(fVar108,CONCAT48(fVar108,CONCAT44(
                                                  fVar108,fVar108))))))));
      }
LAB_014c57eb:
    } while (pauVar29 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }